

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O3

void __thiscall
pstore::index::details::internal_node::internal_node
          (internal_node *this,index_pointer *leaf,hash_type hash)

{
  *(undefined8 *)(this->signature_)._M_elems = 0x6c616e7265746e49;
  this->bitmap_ = 1L << ((byte)hash & 0x3f);
  this->children_[0] = *leaf;
  return;
}

Assistant:

internal_node::internal_node (index_pointer const & leaf, hash_type const hash)
                    : bitmap_{hash_type{1} << hash}
                    , children_{{leaf}} {

                static_assert (std::is_standard_layout<internal_node>::value,
                               "internal internal_node must be standard-layout");
                static_assert (alignof (linear_node) >= 4, "internal_node must have alignment "
                                                           ">= 4 to ensure the bottom two bits "
                                                           "are 0");

                static_assert (offsetof (internal_node, signature_) == 0,
                               "offsetof (internal_node, signature) must be 0");
                static_assert (offsetof (internal_node, bitmap_) == 8,
                               "offsetof (internal_node, bitmap_) must be 8");
                static_assert (offsetof (internal_node, children_) == 16,
                               "offset of the first child must be 16.");
            }